

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O2

int Wlc_NtkDcFlopNum(Wlc_Ntk_t *p)

{
  char *__s;
  size_t sVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  
  __s = p->pInits;
  if (__s == (char *)0x0) {
    iVar3 = 0;
  }
  else {
    sVar1 = strlen(__s);
    uVar4 = 0;
    uVar2 = sVar1 & 0xffffffff;
    if ((int)sVar1 < 1) {
      uVar2 = uVar4;
    }
    iVar3 = 0;
    for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      iVar3 = iVar3 + (uint)((__s[uVar4] & 0xdfU) == 0x58);
    }
  }
  return iVar3;
}

Assistant:

int Wlc_NtkDcFlopNum( Wlc_Ntk_t * p )
{
    int i, nFlops, Count = 0;
    if ( p->pInits == NULL )
        return 0;
    nFlops = strlen(p->pInits);
    for ( i = 0; i < nFlops; i++ )
        Count += (p->pInits[i] == 'x' || p->pInits[i] == 'X');
    return Count;
}